

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O1

void trdmain1(errcxdef *ec,int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  char cVar1;
  appctxdef *appctx_00;
  char *argp_00;
  mcmcx1def *ctx;
  mcmcxdef *mctx;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *pFVar10;
  long lVar11;
  osfildef *swapfp;
  objucxdef *undoctx;
  runsdef *prVar12;
  uchar *puVar13;
  osfildef **ppoVar14;
  uint uVar15;
  ulong swapsize;
  ulong uVar16;
  ulong max;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  bool bVar20;
  int i;
  char **argp;
  int loadopen;
  objnum preinit;
  uint flags;
  runcxdef runctx;
  fiolcxdef fiolctx;
  supcxdef supctx;
  errdef fr_;
  _func_void_bifcxdef_ptr_int *bif [100];
  voccxdef vocctx;
  char infile_abs [4096];
  char inbuf [4096];
  char infile_path [4096];
  char swapbuf [4096];
  int local_6d7c;
  int local_6d78;
  bool local_6d55;
  int local_6d50;
  uint local_6d4c;
  ulong local_6d48;
  char *local_6d40;
  char *local_6d38;
  char *local_6d30;
  char **local_6d28;
  bool local_6d19;
  char local_6d18;
  char local_6d17;
  ushort local_6d16;
  ushort local_6d14;
  ushort local_6d12;
  uint local_6d10;
  uint local_6d0c;
  int local_6d08;
  int local_6d04;
  uint local_6d00;
  uint local_6cfc;
  int local_6cf8;
  int local_6cf4;
  char *local_6cf0;
  appctxdef *local_6ce8;
  uint local_6ce0;
  uint local_6cdc;
  int local_6cd8;
  objnum local_6cd2;
  ulong local_6cd0;
  ulong local_6cc8;
  ulong local_6cc0;
  char *local_6cb8;
  char *local_6cb0;
  char *local_6ca8;
  char *local_6ca0;
  ulong local_6c98;
  objucxdef *local_6c90;
  char *local_6c88;
  char *local_6c80;
  ulong local_6c78;
  char **local_6c70;
  long local_6c68;
  mcmcx1def *local_6c60;
  mcmcxdef *local_6c58;
  char *local_6c50;
  ulong local_6c48;
  char *local_6c40;
  char *local_6c38;
  uint local_6c2c;
  runcxdef local_6c28;
  fiolcxdef local_6b80;
  supcxdef local_6b58;
  errdef local_6b20;
  errcxdef *local_69e8;
  runcxdef *local_69e0;
  undefined8 local_69d8;
  undefined8 uStack_69d0;
  undefined4 local_69bc;
  uint local_6918;
  uint local_6914;
  char *local_6910;
  appctxdef *local_6908;
  re_context local_6900;
  _func_void_bifcxdef_ptr_int *local_6828 [100];
  voccxdef local_6508;
  char local_5348 [4096];
  char local_4348 [4096];
  char local_3348 [4096];
  char local_2348 [4104];
  dbgcxdef local_1340;
  
  local_6cf4 = 0;
  local_6ce8 = appctx;
  local_6c38 = save_ext;
  out_init();
  local_6d50 = 1;
  local_6d28 = argv + 1;
  uVar19 = 2;
  uVar17 = 0xffff;
  uVar18 = 60000;
  local_6c70 = argv;
  if ((argc < 2) || (**local_6d28 != '-')) {
    pcVar8 = (char *)0x0;
    local_6cd8 = 0;
    local_6d55 = false;
    local_6d17 = true;
    max = 0xffffffff;
    uVar16 = 0x200;
    swapsize = 0xffffffff;
    uVar15 = 2;
    local_6d18 = true;
    pcVar7 = pcVar8;
    pcVar9 = pcVar8;
  }
  else {
    iVar6 = 1;
    uVar19 = 2;
    pcVar7 = (char *)0x0;
    local_6cf8 = 0;
    local_6d08 = 0;
    bVar20 = false;
    local_6d04 = 0;
    local_6cc8 = 0xffffffff;
    local_6d16 = 60000;
    local_6d0c = 0xffff;
    local_6d10 = 0x200;
    swapsize = 0xffffffff;
    uVar15 = 2;
    pcVar8 = pcVar7;
    pcVar9 = pcVar7;
    local_6ca0 = *local_6d28;
    do {
      argp_00 = local_6ca0;
      max = local_6cc8;
      local_6d7c = local_6cf8;
      local_6d78 = local_6d04;
      iVar5 = local_6d08;
      uVar4 = local_6d0c;
      uVar3 = local_6d10;
      uVar18 = local_6d16;
      local_6d48 = swapsize;
      local_6d40 = pcVar7;
      local_6d38 = pcVar9;
      switch(local_6ca0[1]) {
      case 'c':
        pcVar7 = local_6ca0 + 1;
        local_6d4c = uVar15;
        local_6d30 = pcVar8;
        iVar2 = strcmp(pcVar7,"ctab");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar7,"ctab-");
          bVar20 = true;
          pcVar8 = local_6d30;
          uVar15 = local_6d4c;
          goto LAB_001ed6d2;
        }
        pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,4,trdusage);
        pcVar8 = local_6d30;
        swapsize = local_6d48;
        uVar15 = local_6d4c;
        break;
      case 'd':
        local_6d4c = uVar15;
        local_6d30 = pcVar8;
        iVar2 = strnicmp(local_6ca0,"-double",7);
        if (iVar2 == 0) {
          iVar6 = cmdtog(ec,iVar6,argp_00,6,trdusage);
          out_set_doublespace(iVar6);
          pcVar8 = local_6d30;
          swapsize = local_6d48;
          pcVar7 = local_6d40;
          uVar15 = local_6d4c;
        }
        else {
LAB_001ed8a7:
          pcVar8 = local_6d30;
          swapsize = local_6d48;
          pcVar7 = local_6d40;
          uVar15 = local_6d4c;
        }
        break;
      default:
        goto switchD_001ed2fc_caseD_65;
      case 'i':
        pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        qasopn(pcVar7,1);
        swapsize = local_6d48;
        goto LAB_001ed830;
      case 'l':
        pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        pFVar10 = fopen(pcVar7,"w");
        ppoVar14 = &logfp;
        goto LAB_001ed80b;
      case 'm':
        if (local_6ca0[2] == 'h') {
          pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,2,trdusage);
          uVar4 = atoi(pcVar7);
          swapsize = local_6d48;
          goto LAB_001ed830;
        }
        if (local_6ca0[2] == 's') {
          local_6d30 = pcVar8;
          pcVar8 = cmdarg(ec,&local_6d28,&local_6d50,argc,2,trdusage);
          uVar3 = atoi(pcVar8);
        }
        else {
          local_6d30 = pcVar8;
          pcVar8 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
          max = atol(pcVar8);
        }
        pcVar8 = local_6d30;
        swapsize = local_6d48;
        pcVar7 = local_6d40;
        break;
      case 'n':
        iVar2 = strcmp(local_6ca0,"-nobanner");
LAB_001ed6d2:
        swapsize = local_6d48;
        pcVar7 = local_6d40;
        pcVar9 = local_6d38;
        if (iVar2 == 0) goto LAB_001ed998;
        goto switchD_001ed2fc_caseD_65;
      case 'o':
        pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        pFVar10 = fopen(pcVar7,"w");
        ppoVar14 = &cmdfile;
LAB_001ed80b:
        *ppoVar14 = (osfildef *)pFVar10;
        swapsize = local_6d48;
        goto LAB_001ed830;
      case 'p':
        local_6d4c = uVar15;
        local_6d30 = pcVar8;
        iVar2 = stricmp(local_6ca0,"-plain");
        if (iVar2 == 0) {
          os_plain();
          goto LAB_001ed8a7;
        }
        local_6d7c = cmdtog(ec,local_6d7c,argp_00,1,trdusage);
        pcVar8 = local_6d30;
        swapsize = local_6d48;
        pcVar7 = local_6d40;
        uVar15 = local_6d4c;
        break;
      case 'r':
        pcVar8 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        swapsize = local_6d48;
        pcVar7 = local_6d40;
        break;
      case 's':
        local_6d30 = pcVar8;
        pcVar8 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        cVar1 = *pcVar8;
        if (cVar1 == 0x3f) {
LAB_001ee44a:
          trdusage_show_range(ec,0xc4e,0xc55);
          errsigf(ec,"TADS",0x5dc);
        }
        uVar15 = (int)cVar1 - 0x30;
        uVar19 = (int)pcVar8[1] - 0x30;
        if (pcVar8[1] == '\0') {
          uVar19 = uVar15;
        }
        if (((byte)(cVar1 - 0x35U) < 0xfb) || (4 < uVar19)) goto LAB_001ee44a;
        if ((local_6ce8 != (appctxdef *)0x0) &&
           (local_6ce8->set_io_safety_level != (_func_void_void_ptr_int_int *)0x0)) {
          (*local_6ce8->set_io_safety_level)(local_6ce8->io_safety_level_ctx,uVar15,uVar19);
        }
        pcVar8 = local_6d30;
        swapsize = local_6d48;
        pcVar7 = local_6d40;
        break;
      case 't':
        cVar1 = local_6ca0[2];
        if (cVar1 == 's') {
          pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,2,trdusage);
          swapsize = atol(pcVar7);
          goto LAB_001ed830;
        }
        if (cVar1 == 'p') {
          iVar5 = cmdtog(ec,local_6d08,local_6ca0,2,trdusage);
          swapsize = local_6d48;
          goto LAB_001ed830;
        }
        if (cVar1 == 'f') {
          local_6d4c = uVar15;
          local_6d30 = pcVar8;
          pcVar9 = cmdarg(ec,&local_6d28,&local_6d50,argc,2,trdusage);
          pcVar8 = local_6d30;
          swapsize = local_6d48;
          pcVar7 = local_6d40;
          uVar15 = local_6d4c;
        }
        else {
          local_6d4c = uVar15;
          local_6d30 = pcVar8;
          local_6d78 = cmdtog(ec,local_6d04,local_6ca0,1,trdusage);
          pcVar8 = local_6d30;
          swapsize = local_6d48;
          pcVar7 = local_6d40;
          uVar15 = local_6d4c;
        }
        goto LAB_001ed998;
      case 'u':
        pcVar7 = cmdarg(ec,&local_6d28,&local_6d50,argc,1,trdusage);
        iVar2 = atoi(pcVar7);
        uVar18 = (ushort)iVar2;
        swapsize = local_6d48;
LAB_001ed830:
        pcVar7 = local_6d40;
      }
      pcVar9 = local_6d38;
LAB_001ed998:
      uVar16 = (ulong)uVar3;
      local_6d28 = local_6d28 + 1;
      local_6d50 = local_6d50 + 1;
      local_6d14 = uVar18;
      local_6d00 = uVar15;
      local_6cfc = uVar19;
      local_6cd0 = max;
      local_6cc0 = swapsize;
      local_6cb8 = pcVar8;
      local_6cb0 = pcVar7;
      local_6ca8 = pcVar9;
      if (argc <= local_6d50) break;
      local_6ca0 = *local_6d28;
      local_6d04 = local_6d78;
      local_6cf8 = local_6d7c;
      local_6d16 = uVar18;
      local_6d10 = uVar3;
      local_6d0c = uVar4;
      local_6d08 = iVar5;
      local_6cc8 = max;
    } while (*local_6ca0 == '-');
    local_6d55 = local_6d78 != 0;
    local_6d18 = !bVar20;
    uVar17 = (ulong)uVar4;
    local_6cd8 = (uint)(iVar5 != 0) * 2;
    local_6d17 = local_6d7c == 0;
  }
  local_6d19 = local_6d55;
  local_6d12 = uVar18;
  local_6ce0 = uVar15;
  local_6cdc = uVar19;
  local_6c88 = pcVar9;
  local_6c78 = uVar17;
  local_6c50 = pcVar7;
  local_6c48 = uVar16;
  local_6c40 = pcVar8;
  if (local_6d50 == argc) {
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      iVar6 = fiorso_getgame(pcVar8,local_4348,0x1000);
      pcVar8 = (char *)0x0;
      if (iVar6 != 0) {
        pcVar8 = local_4348;
      }
    }
    if (pcVar8 == (char *)0x0) {
      if (local_6c70 == (char **)0x0) {
        pcVar7 = "TRX";
      }
      else {
        pcVar7 = "TRX";
        if (*local_6c70 != (char *)0x0) {
          pcVar7 = *local_6c70;
        }
      }
      pFVar10 = (FILE *)os_exeseek(pcVar7,"TGAM");
      if (pFVar10 == (FILE *)0x0) {
        bVar20 = false;
      }
      else {
        local_6c68 = ftell(pFVar10);
        fseek(pFVar10,0,2);
        lVar11 = ftell(pFVar10);
        fclose(pFVar10);
        bVar20 = lVar11 != local_6c68;
      }
    }
    else {
      bVar20 = false;
      pcVar7 = (char *)0x0;
    }
    pcVar9 = (char *)0x1;
    if ((pcVar8 == (char *)0x0) && (!bVar20)) {
      if ((local_6ce8 == (appctxdef *)0x0) ||
         (local_6ce8->get_game_name == (_func_int_void_ptr_char_ptr_size_t *)0x0))
      goto switchD_001ed2fc_caseD_65;
      iVar6 = (*local_6ce8->get_game_name)(local_6ce8->get_game_name_ctx,local_4348,0x1000);
      pcVar8 = local_4348;
      if (iVar6 == 0) {
        pcVar9 = (char *)0x0;
        trdptf("\n");
        trdptf("(No game has been selected.)\n");
        pcVar8 = pcVar9;
      }
    }
    if ((char)pcVar9 == '\0') {
      return;
    }
  }
  else {
    local_6c98 = swapsize;
    if (local_6d50 + 1 != argc) {
switchD_001ed2fc_caseD_65:
      trdusage(ec);
      goto LAB_001ee3e9;
    }
    pcVar8 = *local_6d28;
    iVar6 = access(pcVar8,0);
    if (iVar6 != 0) {
      strcpy(local_4348,pcVar8);
      os_defext(local_4348,"gam");
      pcVar8 = local_4348;
    }
    pcVar7 = (char *)0x0;
    swapsize = local_6c98;
  }
  pcVar9 = local_6c88;
  local_6cf0 = pcVar8;
  local_6c80 = pcVar7;
  if ((local_6d19 & swapsize != 0) == 1) {
    swapfp = os_create_tempfile(local_6c88,local_2348);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = local_2348;
    }
    if (swapfp == (osfildef *)0x0) {
      errsigf(ec,"TADS",0xd);
    }
  }
  else {
    swapfp = (osfildef *)0x0;
  }
  if (local_6d18 == '\0') {
    cmap_override();
  }
  else {
    iVar6 = cmap_load(local_6c50);
    if (iVar6 != 0) {
      errsigf(ec,"TADS",0x5e3);
    }
  }
  local_6b20.errcode = _setjmp((__jmp_buf_tag *)local_6b20.errbuf);
  if (local_6b20.errcode == 0) {
    local_6b20.errprv = ec->errcxptr;
    ec->errcxptr = &local_6b20;
    local_6c60 = mcmini(max,0x80,swapsize,swapfp,pcVar9,ec);
    undoctx = (objucxdef *)0x0;
    local_6c58 = mcmcini(local_6c60,0x80,fioldobj,&local_6b80,objrevert,(void *)0x0);
    local_6c58->mcmcxrvc = local_6c58;
    if (local_6d12 != 0) {
      undoctx = objuini(local_6c58,local_6d12,vocdundo,vocdusz,&local_6508);
    }
    local_6c90 = undoctx;
    vocini(&local_6508,ec,local_6c58,&local_6c28,undoctx,100,100,200);
    uVar17 = local_6c48;
    main_voc_ctx = &local_6508;
    prVar12 = (runsdef *)mchalo(ec,local_6c48 * 0x10,"runtime stack");
    puVar13 = mchalo(ec,local_6c78,"runtime heap");
    pcVar8 = local_6cf0;
    if ((local_6cf0 == (char *)0x0) && (pcVar8 = local_6c80, local_6c80 == (char *)0x0)) {
      local_5348[0] = '\0';
    }
    else {
      os_get_abs_filename(local_5348,0x1000,pcVar8);
    }
    os_get_path_name(local_3348,0x1000,local_5348);
    mctx = local_6c58;
    local_6c28.runcxmem = local_6c58;
    local_6c28.runcxstop = prVar12 + uVar17;
    local_6c28.runcxhtop = puVar13 + local_6c78;
    local_6c28.runcxundo = local_6c90;
    local_6c28.runcxbcx = &local_69e8;
    local_6c28.runcxbi = local_6828;
    local_6c28.runcxtio = (tiocxdef *)0x0;
    local_6c28.runcxdbg = &local_1340;
    local_6c28.runcxvoc = &local_6508;
    local_6c28.runcxdmd = supcont;
    local_6c28.runcxext = (runxdef *)0x0;
    local_6c28.runcxgamename = local_6cf0;
    local_6c28.runcxgamepath = local_3348;
    local_6b58.supcxmem = local_6c58;
    local_6b58.supcxtab = (tokthdef *)0x0;
    local_6b58.supcxbuf = (uchar *)0x0;
    local_6b58.supcxlen = 0;
    local_6b58.supcxrun = &local_6c28;
    local_1340.dbgcxtio = (tiocxdef *)0x0;
    local_1340.dbgcxtab = (tokthdef *)0x0;
    local_1340.dbgcxmem = local_6c58;
    local_1340.dbgcxflg = 0;
    local_1340.dbgcxlin = (lindef *)0x0;
    local_1340.dbgcxfcn = 0;
    local_1340.dbgcxdep = 0;
    local_6c28.runcxerr = ec;
    local_6c28.runcxstk = prVar12;
    local_6c28.runcxsp = prVar12;
    local_6c28.runcxbp = prVar12;
    local_6c28.runcxheap = puVar13;
    local_6c28.runcxhp = puVar13;
    local_6c28.runcxdmc = &local_6b58;
    local_6b58.supcxerr = ec;
    local_6b58.supcxvoc = local_6c28.runcxvoc;
    local_1340.dbgcxerr = ec;
    memset(local_6c28.runcxbcx,0,0x1c0);
    appctx_00 = local_6ce8;
    local_69e0 = &local_6c28;
    local_69bc = 0;
    local_69d8 = 0;
    uStack_69d0 = 0;
    local_6908 = local_6ce8;
    local_6918 = local_6ce0;
    local_6914 = local_6cdc;
    local_6910 = local_6c38;
    local_69e8 = ec;
    re_init(&local_6900,ec);
    supbif(&local_6b58,local_6828,100);
    runistat(&local_6508,&local_6c28,(tiocxdef *)0x0);
    fiord(mctx,&local_6508,(tokcxdef *)0x0,local_6cf0,local_6c80,&local_6b80,&local_6cd2,&local_6c2c
          ,(tokpdef *)0x0,(uchar **)0x0,(uint *)0x0,(uint *)0x0,local_6cd8,appctx_00,*local_6c70);
    local_6cf4 = 1;
    plygo(&local_6c28,&local_6508,(tiocxdef *)0x0,local_6cd2,local_6c40);
    fiorcls(&local_6b80);
    if (local_6d17 == '\0') {
      trdptf("[press a key to exit]");
      os_waitc();
      trdptf("\n");
    }
    ctx = local_6c60;
    trd_close_swapfile(&local_6c28);
    qasclose();
    ec->errcxptr = local_6b20.errprv;
    main_voc_ctx = (voccxdef *)0x0;
    vocterm(&local_6508);
    if (local_6c90 != (objucxdef *)0x0) {
      objuterm(local_6c90);
    }
    mcmcterm(mctx);
    mcmterm(ctx);
    return;
  }
LAB_001ee3e9:
  ec->errcxptr = local_6b20.errprv;
  trd_close_swapfile(&local_6c28);
  if (local_6cf4 != 0) {
    fiorcls(&local_6b80);
  }
  main_voc_ctx = (voccxdef *)0x0;
  vocterm(&local_6508);
  errrse1(ec,&local_6b20);
}

Assistant:

static void trdmain1(errcxdef *ec, int argc, char *argv[],
                     appctxdef *appctx, char *save_ext)
{
    osfildef  *swapfp = (osfildef *)0;
    runcxdef   runctx;
    bifcxdef   bifctx;
    voccxdef   vocctx;
    void     (*bif[100])(struct bifcxdef *, int);
    mcmcxdef  *mctx = 0;
    mcmcx1def *globalctx = 0;
    dbgcxdef   dbg;
    supcxdef   supctx;
    char      *swapname = 0;
    char       swapbuf[OSFNMAX];
    char     **argp;
    char      *arg;
    char      *infile;
    char       infile_abs[OSFNMAX];      /* fully-qualified input file name */
    char       infile_path[OSFNMAX];         /* absolute path to input file */
    char      *exefile;            /* try with executable file if no infile */
    ulong      swapsize = 0xffffffffL;        /* allow unlimited swap space */
    int        swapena = OS_DEFAULT_SWAP_ENABLED;      /* swapping enabled? */
    int        i;
    int        pause = FALSE;                 /* pause after finishing game */
    fiolcxdef  fiolctx;
    noreg int  loadopen = FALSE;
    char       inbuf[OSFNMAX];
    ulong      cachelimit = 0xffffffff;
    ushort     undosiz = TRD_UNDOSIZ;      /* default undo context size 16k */
    objucxdef *undoptr = 0;
    uint       flags;         /* flags used to write the file we're reading */
    objnum     preinit;         /* preinit object, if we need to execute it */
    uint       heapsiz = TRD_HEAPSIZ;
    uint       stksiz = TRD_STKSIZ;
    runsdef   *mystack;
    uchar     *myheap;
    extern osfildef *cmdfile;     /* hacky v1 qa interface - command log fp */
    extern osfildef *logfp;        /* hacky v1 qa interface - output log fp */
    int        preload = FALSE;              /* TRUE => preload all objects */
    ulong      totsize;
    extern voccxdef *main_voc_ctx;
    int        safety_read, safety_write;          /* file I/O safety level */
    char      *restore_file = 0;                    /* .SAV file to restore */
    char      *charmap = 0;                           /* character map file */
    int        charmap_none;       /* explicitly do not use a character set */
	int        doublespace = TRUE;        /* formatter double-space setting */
    
    NOREG((&loadopen))

    /* initialize the output formatter */
    out_init();

    /* set safety level to 2 by default - read any/write current dir only */
    safety_read = safety_write = 2;

    /* no -ctab- yet */
    charmap_none = FALSE;

    /* parse arguments */
    for (i = 1, argp = argv + 1 ; i < argc ; ++argp, ++i)
    {
        arg = *argp;
        if (*arg == '-')
        {
            switch(*(arg+1))
            {
            case 'c':
                if (!strcmp(arg+1, "ctab"))
                {
                    /* get the character mapping table */
                    charmap = cmdarg(ec, &argp, &i, argc, 4, trdusage);
                }
                else if (!strcmp(arg+1, "ctab-"))
                {
                    /* use the default mapping */
                    charmap_none = TRUE;
                }
                else
                    trdusage(ec);
                break;
                     
            case 'r':
                /* restore a game */
                restore_file = cmdarg(ec, &argp, &i, argc, 1, trdusage);
                break;
                
            case 'i':
                qasopn(cmdarg(ec, &argp, &i, argc, 1, trdusage), TRUE);
                break;
                
            case 'o':
                cmdfile = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                  OSFTCMD);
                break;
                
            case 'l':
                logfp = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                OSFTCMD);
                break;

            case 'p':
                if (!stricmp(arg, "-plain"))
                {
                    os_plain();
                    break;
                }
                pause = cmdtog(ec, pause, arg, 1, trdusage);
                break;

            case 'd':
                if (!strnicmp(arg, "-double", 7))
                {
                    /* get the argument value */
                    doublespace = cmdtog(ec, doublespace, arg, 6, trdusage);

                    /* set the double-space mode in the formatter */
                    out_set_doublespace(doublespace);
                    break;
                }
                break;

            case 's':
                {
                    char *p;

                    /* get the option */
                    p = cmdarg(ec, &argp, &i, argc, 1, trdusage);

                    /* if they're asking for help, display detailed usage */
                    if (*p == '?')
                        trdusage_s(ec);

                    /* get the safety level from the argument */
                    safety_read = *p - '0';
                    safety_write = (*(p+1) != '\0' ? *(p+1) - '0' :
                                    safety_read);

                    /* range-check the values */
                    if (safety_read < 0 || safety_read > 4
                        || safety_write < 0 || safety_write > 4)
                        trdusage_s(ec);

                    /* tell the host system about the setting */
                    if (appctx != 0 && appctx->set_io_safety_level != 0)
                        (*appctx->set_io_safety_level)
                            (appctx->io_safety_level_ctx,
                             safety_read, safety_write);
                }
                break;
                
            case 'm':
                switch(*(arg + 2))
                {
                case 's':
                    stksiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'h':
                    heapsiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                default:
                    cachelimit = atol(cmdarg(ec, &argp, &i, argc, 1,
                                             trdusage));
                    break;
                }
				break;

			case 'n':
				/* 
				 *   -nobanner was already parsed and handled by our caller,
				 *   but it's still in the argument list, so just skip it;
				 *   anything else starting with -n is invalid
				 */
				if (strcmp(arg, "-nobanner") != 0)
					trdusage(ec);
				break;

            case 't':
                /* swap file options:  -tf file, -ts size, -t- (no swap) */
                switch(*(arg+2))
                {
                case 'f':
                    swapname = cmdarg(ec, &argp, &i, argc, 2, trdusage);
                    break;
                    
                case 's':
                    swapsize = atol(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'p':
                    preload = cmdtog(ec, preload, arg, 2, trdusage);
                    break;
                    
                default:
                    swapena = cmdtog(ec, swapena, arg, 1, trdusage);
                    break;
                }
                break;
                
            case 'u':
                undosiz = atoi(cmdarg(ec, &argp, &i, argc, 1, trdusage));
                break;
                
            default:
                trdusage(ec);
            }
        }
        else break;
    }

    /* presume we won't take the .gam from the application executable */
    exefile = 0;

    /* get input name argument, and make sure it's the last argument */
    if (i == argc)
    {
        osfildef *fp;
        ulong     curpos;
        ulong     endpos;
        int       use_exe;

        /*
         *   There's no input name argument, so we need to find the game
         *   to play some other way.  First, check to see if we have a
         *   game to restore, and if so whether it has the .GAM name
         *   encoded into it.  Next, look to see if there's a game
         *   attached to the executable file; if so, use it.  If not, see
         *   if the host system wants to provide a name through its
         *   callback.  
         */
        
        /* presume we won't find a game attached to the executable file */
        infile = 0;
        use_exe = FALSE;

        /* 
         *   see if we have a saved game to restore, and it specifies the
         *   GAM file that saved it 
         */
        if (restore_file != 0)
        {
            /* try getting the game name from the restore file */
            if (fiorso_getgame(restore_file, inbuf, sizeof(inbuf)))
            {
                /* got it - use this file */
                infile = inbuf;
            }
        }
        
        /* 
         *   it that didn't work, try to read from os-dependent part of
         *   program being executed 
         */
        if (infile == 0)
        {
            /* try opening the executable file */
            exefile = (argv && argv[0] ? argv[0] : "TRX");
            fp = os_exeseek(exefile, "TGAM");
            if (fp != 0)
            {
                /* see if there's a game file attached to the executable */
                curpos = osfpos(fp);
                osfseek(fp, 0L, OSFSK_END);
                endpos = osfpos(fp);
                osfcls(fp);
                
                /* if we found it, use it */
                if (endpos != curpos)
                    use_exe = TRUE;
            }
        }
            
        /* 
         *   if we didn't find a game in the executable, try the host
         *   system callback 
         */
        if (infile == 0 && !use_exe)
        {
            /* 
             *   ask the host system callback what to do - if we don't
             *   have a host system callback, or the callback 
             */
            if (appctx != 0 && appctx->get_game_name != 0)
            {
                /* call the host system callback */
                if ((*appctx->get_game_name)(appctx->get_game_name_ctx,
                                             inbuf, sizeof(inbuf)))
                {
                    /* the host system provided a name - use it */
                    infile = inbuf;
                }
                else
                {
                    /* 
                     *   the host didn't provide a name - simply display a
                     *   message indicating that no game file has been
                     *   chosen, and return 
                     */
                    trdptf("\n");
                    trdptf("(No game has been selected.)\n");
                    return;
                }
            }
            else
            {
                /* 
                 *   we've run out of ways to get a filename - give the
                 *   user the usage message and quit 
                 */
                trdusage(ec);
            }
        }
    }
    else
    {
        infile = *argp;
        if (i + 1 != argc)
            trdusage(ec);

#ifndef OS_HATES_EXTENSIONS
        /*
         *   If original name exists, use it; otherwise, try adding .GAM.
         *   Note that this code is ifdef'd so that platforms that don't
         *   use filename extensions in the manner conventional for DOS
         *   and Unix won't use this code. 
         */
        if (osfacc(infile))
        {
            strcpy(inbuf, infile);
            os_defext(inbuf, "gam");
            infile = inbuf;
        }
#endif /* !defined(OS_HATES_EXTENSIONS) */
    }
    
    /* open up the swap file */
    if (swapena && swapsize)
    {
        swapfp = os_create_tempfile(swapname, swapbuf);
        if (swapname == 0) swapname = swapbuf;
        if (swapfp == 0) errsig(ec, ERR_OPSWAP);
    }
    
    /* load the character map */
    if (charmap_none)
        cmap_override();
    else if (cmap_load(charmap))
        errsig(ec, ERR_INVCMAP);

    ERRBEGIN(ec)

    /* initialize cache manager context */
    globalctx = mcmini(cachelimit, 128, swapsize, swapfp, swapname, ec);
    mctx = mcmcini(globalctx, 128, fioldobj, &fiolctx,
                   objrevert, (void *)0);
    mctx->mcmcxrvc = mctx;

    /* set up an undo context */
    if (undosiz)
        undoptr = objuini(mctx, undosiz, vocdundo, vocdusz, &vocctx);
    else
        undoptr = (objucxdef *)0;

    /* set up vocabulary context */
    vocini(&vocctx, ec, mctx, &runctx, undoptr, 100, 100, 200);

    /*
     *   save a pointer to the voc context globally, so that certain
     *   external routines (such as Unix-style signal handlers) can reach
     *   it 
     */
    main_voc_ctx = &vocctx;
    
    /* allocate stack and heap */
    totsize = (ulong)stksiz * (ulong)sizeof(runsdef);
    if (totsize != (size_t)totsize)
        errsig1(ec, ERR_STKSIZE, ERRTINT, (uint)(65535/sizeof(runsdef)));
    mystack = (runsdef *)mchalo(ec, (size_t)totsize, "runtime stack");
    myheap = mchalo(ec, heapsiz, "runtime heap");

    /* get the absolute path for the input file */
    if (infile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), infile);
    else if (exefile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), exefile);
    else
        infile_abs[0] = '\0';
    os_get_path_name(infile_path, sizeof(infile_path), infile_abs);

    /* set up execution context */
    runctx.runcxerr = ec;
    runctx.runcxmem = mctx;
    runctx.runcxstk = mystack;
    runctx.runcxstop = &mystack[stksiz];
    runctx.runcxsp = mystack;
    runctx.runcxbp = mystack;
    runctx.runcxheap = myheap;
    runctx.runcxhp = myheap;
    runctx.runcxhtop = &myheap[heapsiz];
    runctx.runcxundo = undoptr;
    runctx.runcxbcx = &bifctx;
    runctx.runcxbi = bif;
    runctx.runcxtio = (tiocxdef *)0;
    runctx.runcxdbg = &dbg;
    runctx.runcxvoc = &vocctx;
    runctx.runcxdmd = supcont;
    runctx.runcxdmc = &supctx;
    runctx.runcxext = 0;
    runctx.runcxgamename = infile;
    runctx.runcxgamepath = infile_path;

    /* set up setup context */
    supctx.supcxerr = ec;
    supctx.supcxmem = mctx;
    supctx.supcxtab = (tokthdef *)0;
    supctx.supcxbuf = (uchar *)0;
    supctx.supcxlen = 0;
    supctx.supcxvoc = &vocctx;
    supctx.supcxrun = &runctx;
    
    /* set up debug context */
    dbg.dbgcxtio = (tiocxdef *)0;
    dbg.dbgcxmem = mctx;
    dbg.dbgcxerr = ec;
    dbg.dbgcxtab = (tokthdef *)0;
    dbg.dbgcxfcn = 0;
    dbg.dbgcxdep = 0;
    dbg.dbgcxflg = 0;
    dbg.dbgcxlin = (lindef *)0;                      /* no line sources yet */
    
    /* set up built-in function context */
    CLRSTRUCT(bifctx);
    bifctx.bifcxerr = ec;
    bifctx.bifcxrun = &runctx;
    bifctx.bifcxtio = (tiocxdef *)0;
    bifctx.bifcxrnd = 0;
    bifctx.bifcxrndset = FALSE;
    bifctx.bifcxappctx = appctx;
    bifctx.bifcxsafetyr = safety_read;
    bifctx.bifcxsafetyw = safety_write;
    bifctx.bifcxsavext = save_ext;

    /* initialize the regular expression parser context */
    re_init(&bifctx.bifcxregex, ec);
    
    /* add the built-in functions, keywords, etc */
    supbif(&supctx, bif, (int)(sizeof(bif)/sizeof(bif[0])));
    
    /* set up status line hack */
    runistat(&vocctx, &runctx, (tiocxdef *)0);

    /* turn on the "busy" cursor before loading */
    os_csr_busy(TRUE);
    
    /* read the game from the binary file */
    fiord(mctx, &vocctx, (struct tokcxdef *)0,
          infile, exefile, &fiolctx, &preinit, &flags,
          (struct tokpdef *)0, (uchar **)0, (uint *)0, (uint *)0,
          (preload ? 2 : 0), appctx, argv[0]);
    loadopen = TRUE;

    /* turn off the "busy" cursor */
    os_csr_busy(FALSE);
    
    /* play the game */
    plygo(&runctx, &vocctx, (tiocxdef *)0, preinit, restore_file);
    
    /* close load file */
    fiorcls(&fiolctx);
    
    if (pause)
    {
        trdptf("[press a key to exit]");
        os_waitc();
        trdptf("\n");
    }
    
    /* close and delete swapfile, if one was opened */
    trd_close_swapfile(&runctx);

    /* make sure the script file is closed, if we have one */
    qasclose();

    ERRCLEAN(ec)
        /* close and delete swapfile, if one was opened */
        trd_close_swapfile(&runctx);
        
        /* close the load file if one was opened */
        if (loadopen)
            fiorcls(&fiolctx);

        /* vocctx is going out of scope - forget the global reference to it */
        main_voc_ctx = 0;

        /* delete the voc context */
        vocterm(&vocctx);

        /* delete the undo context */
        if (undoptr != 0)
            objuterm(undoptr);

        /* release the object cache structures */
        if (mctx != 0)
            mcmcterm(mctx);
        if (globalctx != 0)
            mcmterm(globalctx);
    ERRENDCLN(ec)

    /* vocctx is going out of scope - forget the global reference to it */
    main_voc_ctx = 0;

    /* delete the voc contxt */
    vocterm(&vocctx);

    /* delete the undo context */
    if (undoptr != 0)
        objuterm(undoptr);

    /* release the object cache structures */
    mcmcterm(mctx);
    mcmterm(globalctx);
}